

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O0

FT_Error af_property_get_face_globals(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  AF_FaceGlobals local_38;
  AF_FaceGlobals globals;
  AF_Module pAStack_28;
  FT_Error error;
  AF_Module module_local;
  AF_FaceGlobals *aglobals_local;
  FT_Face face_local;
  
  globals._4_4_ = 0;
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else {
    local_38 = (AF_FaceGlobals)(face->autohint).data;
    module_local = (AF_Module)aglobals;
    if ((local_38 == (AF_FaceGlobals)0x0) &&
       (pAStack_28 = module, aglobals_local = (AF_FaceGlobals *)face,
       globals._4_4_ = af_face_globals_new(face,&local_38,module), globals._4_4_ == 0)) {
      aglobals_local[0x1b] = local_38;
      aglobals_local[0x1c] = (AF_FaceGlobals)af_face_globals_free;
    }
    if (globals._4_4_ == 0) {
      (module_local->root).clazz = (FT_Module_Class *)local_38;
    }
    face_local._4_4_ = globals._4_4_;
  }
  return face_local._4_4_;
}

Assistant:

static FT_Error
  af_property_get_face_globals( FT_Face          face,
                                AF_FaceGlobals*  aglobals,
                                AF_Module        module )
  {
    FT_Error        error = FT_Err_Ok;
    AF_FaceGlobals  globals;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    globals = (AF_FaceGlobals)face->autohint.data;
    if ( !globals )
    {
      /* trigger computation of the global style data */
      /* in case it hasn't been done yet              */
      error = af_face_globals_new( face, &globals, module );
      if ( !error )
      {
        face->autohint.data =
          (FT_Pointer)globals;
        face->autohint.finalizer =
          (FT_Generic_Finalizer)af_face_globals_free;
      }
    }

    if ( !error )
      *aglobals = globals;

    return error;
  }